

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateAttributeType
          (HtmlparserCppTest *this,string *expected_attr_type)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  HtmlparserCppTest *pHVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar6;
  HtmlParser *this_00;
  const_iterator cVar7;
  mapped_type *ppHVar8;
  undefined8 extraout_RAX_02;
  undefined7 uVar9;
  ulong uVar10;
  htmlparser_ctx *phVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  HtmlparserCppTest *pHVar14;
  htmlparser_ctx_s *phVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  pointer this_01;
  _Base_ptr unaff_R12;
  _Base_ptr unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_1a8;
  _Base_ptr p_Stack_190;
  _Base_ptr p_Stack_188;
  undefined1 auStack_148 [16];
  _Base_ptr p_Stack_138;
  _Base_ptr p_Stack_130;
  _Base_ptr p_Stack_128;
  undefined1 auStack_120 [16];
  _Base_ptr p_Stack_110;
  _Base_ptr p_Stack_108;
  _Base_ptr p_Stack_100;
  char *pcStack_f8;
  HtmlParser HStack_f0;
  allocator aStack_b1;
  HtmlparserCppTest *pHStack_b0;
  size_t sStack_a8;
  HtmlparserCppTest HStack_a0;
  HtmlparserCppTest *pHStack_60;
  ulong uStack_58;
  string *psStack_48;
  allocator local_31;
  HtmlparserCppTest *local_30;
  size_t local_28;
  
  pHVar14 = (HtmlparserCppTest *)(this->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar14);
  puVar12 = kAttributeTypeMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar14,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (expected_attr_type->_M_string_length == 0) {
    ValidateAttributeType();
  }
  else {
    unaff_R14 = (_Base_ptr)&local_30;
    std::__cxx11::string::string((string *)unaff_R14,(char *)pHVar5,&local_31);
    sVar2 = expected_attr_type->_M_string_length;
    puVar12 = (undefined1 *)pHVar5;
    if (sVar2 == local_28) {
      uVar9 = (undefined7)((ulong)expected_attr_type >> 8);
      if (sVar2 == 0) {
        expected_attr_type = (string *)CONCAT71(uVar9,1);
      }
      else {
        puVar12 = (undefined1 *)local_30;
        iVar4 = bcmp((expected_attr_type->_M_dataplus)._M_p,local_30,sVar2);
        expected_attr_type = (string *)CONCAT71(uVar9,iVar4 == 0);
      }
    }
    else {
      expected_attr_type = (string *)0x0;
    }
    if (local_30 != (HtmlparserCppTest *)&stack0xffffffffffffffe0) {
      operator_delete(local_30);
    }
    pHVar14 = local_30;
    if ((char)expected_attr_type != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_58 = 0x10715c;
  psStack_48 = expected_attr_type;
  bVar3 = StringToBool((string *)puVar12);
  uVar10 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar15 = (pHVar14->parser_).parser_;
  uStack_58 = 0x107167;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar15);
  if (SUB81(uVar10,0) == (iVar4 != 0)) {
    return;
  }
  uStack_58 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_60 = pHVar14;
  uStack_58 = uVar10;
  bVar3 = StringToBool((string *)puVar12);
  phVar11 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var16 = *(_Base_ptr *)(phVar15 + 0x30);
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x107197;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var16);
  if (SUB81(phVar11,0) == (iVar4 != 0)) {
    return;
  }
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar15;
  HStack_a0.parser_.parser_ = phVar11;
  bVar3 = StringToBool((string *)puVar12);
  p_Var17 = p_Var16[1]._M_left;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var17);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar14 = (HtmlparserCppTest *)p_Var17[1]._M_left;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var16;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = unaff_R14;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar14);
  puVar13 = kJavascriptStateMap;
  pHVar5 = (HtmlparserCppTest *)IdToName(pHVar14,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar12)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    unaff_R14 = (_Base_ptr)&pHStack_b0;
    std::__cxx11::string::string((string *)unaff_R14,(char *)pHVar5,&aStack_b1);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar12)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar13 = (undefined1 *)pHVar5;
    if (sVar2 == sStack_a8) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        puVar13 = (undefined1 *)pHStack_b0;
        iVar4 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar12)->contextMap)._M_t._M_impl,
                     pHStack_b0,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_b0 != &HStack_a0) {
      operator_delete(pHStack_b0);
    }
    pHVar14 = pHStack_b0;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar13);
  p_Var16 = (_Base_ptr)(pHVar14->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var16);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar5 = (HtmlparserCppTest *)&pcStack_f8;
  HStack_f0.parser_ = (htmlparser_ctx *)pHVar14;
  if (*(long *)&(((HtmlparserCppTest *)puVar13)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var17 = p_Var16;
  }
  else {
    p_Stack_100 = (_Base_ptr)0x1072b8;
    pcStack_f8 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var17 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar13)->contextMap)._M_t._M_impl;
    p_Stack_100 = (_Base_ptr)0x1072d4;
    unaff_R14 = (_Base_ptr)strtol((char *)p_Var17,&pcStack_f8,10);
    puVar13 = (undefined1 *)pHVar5;
    if (*pcStack_f8 == '\0') {
      bVar3 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_f8;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)&pcStack_f8;
    }
  }
  if (bVar3) {
    p_Var17 = p_Var16[1]._M_left;
    p_Stack_100 = (_Base_ptr)0x1072fc;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var17);
    if ((int)unaff_R14 == iVar4) {
      return;
    }
  }
  else {
    p_Stack_100 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_100 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar14 = (HtmlparserCppTest *)auStack_120;
  auStack_120._8_8_ = p_Var16;
  p_Stack_110 = unaff_R12;
  p_Stack_108 = unaff_R14;
  p_Stack_100 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar13)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var16 = p_Var17;
  }
  else {
    p_Stack_128 = (_Base_ptr)0x107332;
    auStack_120._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var16 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar13)->contextMap)._M_t._M_impl;
    p_Stack_128 = (_Base_ptr)0x10734e;
    unaff_R14 = (_Base_ptr)strtol((char *)p_Var16,(char **)auStack_120,10);
    puVar13 = (undefined1 *)pHVar14;
    if (*(char *)auStack_120._0_8_ == '\0') {
      bVar3 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_120;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)auStack_120;
    }
  }
  if (bVar3) {
    p_Var16 = p_Var17[1]._M_left;
    p_Stack_128 = (_Base_ptr)0x107376;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var16);
    if ((int)unaff_R14 == iVar4) {
      return;
    }
  }
  else {
    p_Stack_128 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_128 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar14 = (HtmlparserCppTest *)auStack_148;
  auStack_148._8_8_ = p_Var17;
  p_Stack_138 = unaff_R12;
  p_Stack_130 = unaff_R14;
  p_Stack_128 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar13)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var17 = p_Var16;
  }
  else {
    auStack_148._0_8_ = extraout_RAX_01;
    piVar6 = __errno_location();
    *piVar6 = 0;
    p_Var17 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar13)->contextMap)._M_t._M_impl;
    unaff_R14 = (_Base_ptr)strtol((char *)p_Var17,(char **)auStack_148,10);
    puVar13 = (undefined1 *)pHVar14;
    if (*(char *)auStack_148._0_8_ == '\0') {
      bVar3 = *piVar6 == 0;
      unaff_R12 = (_Base_ptr)auStack_148;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)auStack_148;
    }
  }
  if (bVar3) {
    p_Var17 = p_Var16[1]._M_left;
    iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var17);
    if ((int)unaff_R14 == iVar4) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar3 = StringToBool((string *)puVar13);
  pHVar14 = (HtmlparserCppTest *)p_Var17[1]._M_left;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar14);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1a8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_190 = p_Var17;
  p_Stack_188 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar13,"=",",",&vStack_1a8);
  if (vStack_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_1a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar14->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_1a8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar14,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar14,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar14,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar14,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar14,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar14,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar14,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar14,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar14,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar14,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar14,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar14,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar14,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar14,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar7 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar14,str);
                                    if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar8 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar14->contextMap,str);
                                      *ppHVar8 = this_00;
                                    }
                                    ppHVar8 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::operator[](&pHVar14->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar8,&pHVar14->parser_);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar7 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar14,str);
                                      if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_1a8);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar8 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                ::operator[](&pHVar14->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar14->parser_,*ppHVar8);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar14->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar14->parser_).parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_0010784b;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar14->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_1a8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_1a8);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateAttributeType(
    const string &expected_attr_type) {
  const char *parsed_attr_type = IdToName(kAttributeTypeMap,
                                          parser_.AttributeType());
  EXPECT_TRUE(parsed_attr_type != NULL);
  EXPECT_TRUE(!expected_attr_type.empty());
  EXPECT_EQ(expected_attr_type, string(parsed_attr_type))
      << "Unexpected attr_type value at line " << parser_.line_number();
}